

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

FStat * FStat::FindStat(char *name)

{
  FStat *pFVar1;
  int iVar2;
  FStat **ppFVar3;
  
  ppFVar3 = &FirstStat;
  while( true ) {
    pFVar1 = *ppFVar3;
    if (pFVar1 == (FStat *)0x0) {
      return (FStat *)0x0;
    }
    iVar2 = strcasecmp(name,pFVar1->m_Name);
    if (iVar2 == 0) break;
    ppFVar3 = &pFVar1->m_Next;
  }
  return pFVar1;
}

Assistant:

FStat *FStat::FindStat (const char *name)
{
	FStat *stat = FirstStat;

	while (stat && stricmp (name, stat->m_Name))
		stat = stat->m_Next;

	return stat;
}